

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O2

bool GGUFMeta::GKV<bool>::set(gguf_context *ctx,int k,bool *target,llama_model_kv_override *ovrd)

{
  type_conflict1 tVar1;
  bool bVar2;
  bool bVar3;
  
  tVar1 = try_override<bool>(target,ovrd);
  bVar3 = true;
  if (!tVar1) {
    if (k < 0) {
      bVar3 = false;
    }
    else {
      bVar2 = get_kv(ctx,k);
      *target = bVar2;
    }
  }
  return bVar3;
}

Assistant:

static bool set(const gguf_context * ctx, const int k, T & target, const struct llama_model_kv_override * ovrd = nullptr) {
            if (try_override<T>(target, ovrd)) {
                return true;
            }
            if (k < 0) { return false; }
            target = get_kv(ctx, k);
            return true;
        }